

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromHexadecimalString
          (IEEEFloat *this,StringRef s,roundingMode rounding_mode)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  short sVar5;
  opStatus oVar6;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  short sVar12;
  byte *pbVar13;
  byte *pbVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  Significand *dst;
  ulong uVar18;
  bool bVar19;
  lostFraction lost_fraction;
  Significand *pSVar20;
  byte *end;
  bool bVar21;
  iterator dot;
  byte *local_38;
  
  pbVar14 = (byte *)s.Data;
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  uVar11 = this->semantics->precision;
  pSVar20 = &this->significand;
  dst = pSVar20;
  if (uVar11 - 0x40 < 0xffffff80) {
    dst = (Significand *)(this->significand).parts;
  }
  lost_fraction = lfExactlyZero;
  APInt::tcSet(&dst->part,0,uVar11 + 0x40 >> 6);
  this->exponent = 0;
  uVar11 = this->semantics->precision;
  if (uVar11 - 0x40 < 0xffffff80) {
    pSVar20 = (Significand *)(this->significand).parts;
  }
  uVar11 = uVar11 & 0xffffffc0;
  end = pbVar14 + s.Length;
  pbVar7 = (byte *)skipLeadingZeroesAndAnyDot((iterator)pbVar14,(iterator)end,(iterator *)&local_38)
  ;
  pbVar10 = local_38;
  pbVar13 = pbVar7;
  if (pbVar7 != end) {
    uVar8 = uVar11 + 0x40;
    lost_fraction = lfExactlyZero;
    bVar19 = false;
    do {
      bVar1 = *pbVar13;
      iVar16 = (int)(char)bVar1;
      if (iVar16 == 0x2e) {
        bVar21 = pbVar10 != end;
        pbVar10 = pbVar13;
        pbVar4 = pbVar13;
        if (bVar21) {
          __assert_fail("dot == end && \"String contains multiple dots\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0x8f6,
                        "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                       );
        }
      }
      else {
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar17 = iVar16 - 0x30;
        }
        else if ((byte)(bVar1 + 0x9f) < 6) {
          uVar17 = iVar16 - 0x57;
        }
        else {
          if (5 < (byte)(bVar1 + 0xbf)) break;
          uVar17 = iVar16 - 0x37;
        }
        if (uVar17 == 0xffffffff) break;
        uVar18 = (ulong)uVar17;
        pbVar4 = local_38;
        if (uVar8 == 0) {
          uVar8 = 0;
          bVar15 = true;
          bVar21 = !bVar19;
          bVar19 = bVar15;
          if (((bVar21) && (lost_fraction = lfMoreThanHalf, uVar17 < 9)) &&
             (lost_fraction = lfLessThanHalf, pbVar3 = pbVar13, (uVar17 & 7) == 0)) {
            do {
              pbVar3 = pbVar3 + 1;
              if (pbVar3 == end) {
                __assert_fail("p != end && \"Invalid trailing hexadecimal fraction!\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                              ,0x194,
                              "lostFraction llvm::trailingHexadecimalFraction(StringRef::iterator, StringRef::iterator, unsigned int)"
                             );
              }
              bVar1 = *pbVar3;
            } while ((bVar1 == 0x30) || (bVar1 == 0x2e));
            iVar16 = (int)(char)bVar1;
            uVar8 = 0;
            if ((byte)(bVar1 - 0x30) < 10) {
              iVar16 = iVar16 + -0x30;
LAB_001658ab:
              if (iVar16 != -1) {
                lost_fraction = (uint)(uVar18 != 0) * 2 + lfLessThanHalf;
                goto LAB_00165820;
              }
            }
            else {
              if ((byte)(bVar1 + 0x9f) < 6) {
                iVar16 = iVar16 + -0x57;
                goto LAB_001658ab;
              }
              if ((byte)(bVar1 + 0xbf) < 6) {
                iVar16 = iVar16 + -0x37;
                goto LAB_001658ab;
              }
            }
            lost_fraction = (uint)(uVar18 != 0) * 2;
          }
        }
        else {
          uVar8 = uVar8 - 4;
          pSVar20[uVar8 >> 6].part = pSVar20[uVar8 >> 6].part | uVar18 << ((byte)uVar8 & 0x3f);
        }
      }
LAB_00165820:
      local_38 = pbVar4;
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != end);
  }
  if (pbVar13 == end) {
    __assert_fail("p != end && \"Hex strings require an exponent\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90d,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if ((*pbVar13 | 0x20) != 0x70) {
    __assert_fail("(*p == \'p\' || *p == \'P\') && \"Invalid character in significand\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90e,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (pbVar13 == pbVar14) {
    __assert_fail("p != begin && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x90f,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (((long)pbVar13 - (long)pbVar14 == 1) && (pbVar10 != end)) {
    __assert_fail("(dot == end || p - begin != 1) && \"Significand has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x910,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertFromHexadecimalString(StringRef, roundingMode)"
                 );
  }
  if (pbVar13 != pbVar7) {
    if (pbVar10 == end) {
      pbVar10 = pbVar13;
      local_38 = pbVar13;
    }
    pbVar14 = pbVar13 + 1;
    if (pbVar14 == end) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xf6,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
    }
    bVar1 = *pbVar14;
    if (((bVar1 == 0x2d) || (bVar1 == 0x2b)) && (pbVar14 = pbVar13 + 2, pbVar14 == end)) {
      __assert_fail("p != end && \"Exponent has no digits\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xfb,"int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
    }
    iVar16 = 0;
    for (; pbVar14 != end; pbVar14 = pbVar14 + 1) {
      if (9 < (int)(char)*pbVar14 - 0x30U) {
        __assert_fail("value < 10U && \"Invalid character in exponent\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x104,
                      "int llvm::totalExponent(StringRef::iterator, StringRef::iterator, int)");
      }
      iVar16 = ((int)(char)*pbVar14 - 0x30U) + iVar16 * 10;
      if (0x7fff < iVar16) goto LAB_0016599e;
    }
    iVar9 = (int)pbVar10 - (int)pbVar7;
    iVar9 = (this->semantics->precision - uVar11) + (iVar9 - (iVar9 >> 0x1f)) * 4 + -0x41;
    if ((short)iVar9 == iVar9) {
      iVar2 = -iVar16;
      if (bVar1 != 0x2d) {
        iVar2 = iVar16;
      }
      sVar12 = 0x7fff;
      if (bVar1 == 0x2d) {
        sVar12 = -0x8000;
      }
      sVar5 = (short)(iVar2 + iVar9);
      if ((int)sVar5 != iVar2 + iVar9) {
        sVar5 = sVar12;
      }
    }
    else {
LAB_0016599e:
      sVar5 = 0x7fff;
      if (bVar1 == 0x2d) {
        sVar5 = -0x8000;
      }
    }
    this->exponent = sVar5;
  }
  oVar6 = normalize(this,rounding_mode,lost_fraction);
  return oVar6;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromHexadecimalString(StringRef s,
                                        roundingMode rounding_mode) {
  lostFraction lost_fraction = lfExactlyZero;

  category = fcNormal;
  zeroSignificand();
  exponent = 0;

  integerPart *significand = significandParts();
  unsigned partsCount = partCount();
  unsigned bitPos = partsCount * integerPartWidth;
  bool computedTrailingFraction = false;

  // Skip leading zeroes and any (hexa)decimal point.
  StringRef::iterator begin = s.begin();
  StringRef::iterator end = s.end();
  StringRef::iterator dot;
  StringRef::iterator p = skipLeadingZeroesAndAnyDot(begin, end, &dot);
  StringRef::iterator firstSignificantDigit = p;

  while (p != end) {
    integerPart hex_value;

    if (*p == '.') {
      assert(dot == end && "String contains multiple dots");
      dot = p++;
      continue;
    }

    hex_value = hexDigitValue(*p);
    if (hex_value == -1U)
      break;

    p++;

    // Store the number while we have space.
    if (bitPos) {
      bitPos -= 4;
      hex_value <<= bitPos % integerPartWidth;
      significand[bitPos / integerPartWidth] |= hex_value;
    } else if (!computedTrailingFraction) {
      lost_fraction = trailingHexadecimalFraction(p, end, hex_value);
      computedTrailingFraction = true;
    }
  }

  /* Hex floats require an exponent but not a hexadecimal point.  */
  assert(p != end && "Hex strings require an exponent");
  assert((*p == 'p' || *p == 'P') && "Invalid character in significand");
  assert(p != begin && "Significand has no digits");
  assert((dot == end || p - begin != 1) && "Significand has no digits");

  /* Ignore the exponent if we are zero.  */
  if (p != firstSignificantDigit) {
    int expAdjustment;

    /* Implicit hexadecimal point?  */
    if (dot == end)
      dot = p;

    /* Calculate the exponent adjustment implicit in the number of
       significant digits.  */
    expAdjustment = static_cast<int>(dot - firstSignificantDigit);
    if (expAdjustment < 0)
      expAdjustment++;
    expAdjustment = expAdjustment * 4 - 1;

    /* Adjust for writing the significand starting at the most
       significant nibble.  */
    expAdjustment += semantics->precision;
    expAdjustment -= partsCount * integerPartWidth;

    /* Adjust for the given exponent.  */
    exponent = totalExponent(p + 1, end, expAdjustment);
  }

  return normalize(rounding_mode, lost_fraction);
}